

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRead.c
# Opt level: O3

int Cudd_addRead(FILE *fp,DdManager *dd,DdNode **E,DdNode ***x,DdNode ***y,DdNode ***xn,
                DdNode ***yn_,int *nx,int *ny,int *m,int *n,int bx,int sx,int by,int sy)

{
  uint uVar1;
  int *piVar2;
  DdNode *T;
  bool bVar3;
  int iVar4;
  DdNode **ppDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode **ppDVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  uint uVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  double val;
  uint local_98;
  uint local_94;
  DdNode ***local_90;
  uint local_88;
  uint local_84;
  ulong local_80;
  DdNode **local_78;
  DdNode **local_70;
  DdNode **local_68;
  FILE *local_60;
  DdNode *local_58;
  DdNode *local_50;
  double local_48;
  long local_40;
  long local_38;
  
  T = dd->one;
  pDVar10 = dd->zero;
  local_90 = (DdNode ***)((ulong)local_90 & 0xffffffff00000000);
  local_68 = E;
  local_60 = (FILE *)fp;
  iVar4 = __isoc99_fscanf(fp,"%d %d",&local_94,&local_98);
  if (iVar4 != 2) goto LAB_00791f3b;
  *m = local_94;
  local_70 = *x;
  ppDVar5 = *xn;
  uVar1 = local_94 - 1;
  uVar11 = 0;
  bVar3 = 1 < (int)local_94;
  local_94 = uVar1;
  if (bVar3) {
    uVar11 = 0;
    do {
      local_94 = uVar1 >> 1;
      uVar11 = uVar11 + 1;
      bVar3 = 1 < uVar1;
      uVar1 = local_94;
    } while (bVar3);
  }
  local_90 = xn;
  if (*nx < (int)uVar11) {
    sVar12 = (ulong)uVar11 * 8;
    local_78 = (DdNode **)y;
    if (local_70 == (DdNode **)0x0) {
      local_70 = (DdNode **)malloc(sVar12);
    }
    else {
      local_70 = (DdNode **)realloc(local_70,sVar12);
    }
    *x = local_70;
    if (local_70 != (DdNode **)0x0) {
      sVar12 = (ulong)uVar11 << 3;
      if (*local_90 == (DdNode **)0x0) {
        ppDVar5 = (DdNode **)malloc(sVar12);
      }
      else {
        ppDVar5 = (DdNode **)realloc(*local_90,sVar12);
      }
      *local_90 = ppDVar5;
      y = (DdNode ***)local_78;
      if (ppDVar5 != (DdNode **)0x0) goto LAB_00791c75;
    }
  }
  else {
LAB_00791c75:
    *n = local_98;
    local_58 = (DdNode *)*y;
    local_50 = (DdNode *)*yn_;
    uVar1 = local_98 - 1;
    local_88 = 0;
    bVar3 = 1 < (int)local_98;
    local_98 = uVar1;
    if (bVar3) {
      local_88 = 0;
      do {
        local_98 = uVar1 >> 1;
        local_88 = local_88 + 1;
        bVar3 = 1 < uVar1;
        uVar1 = local_98;
      } while (bVar3);
    }
    local_84 = uVar11;
    if ((int)local_88 <= *ny) {
LAB_00791d45:
      iVar4 = *nx;
      lVar13 = (long)iVar4;
      if (iVar4 < (int)local_84) {
        iVar4 = iVar4 * sx + bx;
        local_80 = (ulong)(int)local_84;
        local_78 = ppDVar5;
        ppDVar8 = local_70;
        do {
          do {
            dd->reordered = 0;
            pDVar6 = cuddUniqueInter(dd,iVar4,T,pDVar10);
            ppDVar5 = local_78;
            ppDVar8[lVar13] = pDVar6;
          } while (dd->reordered == 1);
          local_90 = (DdNode ***)((ulong)local_90 & 0xffffffff00000000);
          if (pDVar6 == (DdNode *)0x0) goto LAB_00791f3b;
          piVar2 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          do {
            dd->reordered = 0;
            pDVar6 = cuddUniqueInter(dd,iVar4,pDVar10,T);
            ppDVar5[lVar13] = pDVar6;
          } while (dd->reordered == 1);
          if (pDVar6 == (DdNode *)0x0) goto LAB_00791f3b;
          piVar2 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          lVar13 = lVar13 + 1;
          iVar4 = iVar4 + sx;
          ppDVar8 = local_70;
        } while (lVar13 != local_80);
      }
      iVar4 = *ny;
      lVar13 = (long)iVar4;
      if (iVar4 < (int)local_88) {
        iVar4 = iVar4 * sy + by;
        local_80 = (ulong)(int)local_88;
        local_78 = ppDVar5;
        pDVar6 = local_58;
        do {
          do {
            dd->reordered = 0;
            pDVar7 = cuddUniqueInter(dd,iVar4,T,pDVar10);
            pDVar9 = local_50;
            *(DdNode **)(&pDVar6->index + lVar13 * 2) = pDVar7;
          } while (dd->reordered == 1);
          local_90 = (DdNode ***)((ulong)local_90 & 0xffffffff00000000);
          if (pDVar7 == (DdNode *)0x0) goto LAB_00791f3b;
          piVar2 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          do {
            dd->reordered = 0;
            pDVar6 = cuddUniqueInter(dd,iVar4,pDVar10,T);
            *(DdNode **)(&pDVar9->index + lVar13 * 2) = pDVar6;
          } while (dd->reordered == 1);
          if (pDVar6 == (DdNode *)0x0) goto LAB_00791f3b;
          piVar2 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          lVar13 = lVar13 + 1;
          iVar4 = iVar4 + sy;
          ppDVar5 = local_78;
          pDVar6 = local_58;
        } while (lVar13 != local_80);
      }
      uVar11 = local_84;
      uVar1 = local_88;
      *nx = local_84;
      *ny = local_88;
      pDVar10 = dd->background;
      *local_68 = pDVar10;
      piVar2 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      iVar4 = feof(local_60);
      if (iVar4 == 0) {
        local_80 = (ulong)T & 0xfffffffffffffffe;
        local_38 = (ulong)uVar11 + 1;
        local_40 = (ulong)uVar1 + 1;
        do {
          lVar13 = local_38;
          uVar14 = local_80;
          iVar4 = __isoc99_fscanf(local_60,"%d %d %lf",&local_94,&local_98,&local_48);
          if (iVar4 != 3) {
            local_90 = (DdNode ***)0x0;
            if (iVar4 != -1) goto LAB_00791f3b;
            break;
          }
          if ((*m <= (int)local_94) || (*n <= (int)local_98)) goto LAB_00791f33;
          local_90 = (DdNode ***)((ulong)local_90 & 0xffffffff00000000);
          if ((int)(local_98 | local_94) < 0) goto LAB_00791f3b;
          *(int *)(uVar14 + 4) = *(int *)(uVar14 + 4) + 1;
          pDVar10 = T;
          pDVar6 = T;
          if (0 < (int)local_84) {
            do {
              ppDVar8 = local_70;
              if ((local_94 & 1) == 0) {
                ppDVar8 = ppDVar5;
              }
              pDVar6 = Cudd_addApply(dd,Cudd_addTimes,pDVar10,ppDVar8[lVar13 + -2]);
              if (pDVar6 == (DdNode *)0x0) goto LAB_00792170;
              piVar2 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
              *piVar2 = *piVar2 + 1;
              Cudd_RecursiveDeref(dd,pDVar10);
              local_94 = (int)local_94 >> 1;
              lVar13 = lVar13 + -1;
              pDVar10 = pDVar6;
            } while (1 < lVar13);
          }
          pDVar10 = pDVar6;
          lVar13 = local_40;
          if (0 < (int)local_88) {
            do {
              pDVar6 = local_58;
              if ((local_98 & 1) == 0) {
                pDVar6 = local_50;
              }
              pDVar6 = Cudd_addApply(dd,Cudd_addTimes,pDVar10,
                                     *(DdNode **)((long)pDVar6 + lVar13 * 8 + -0x10));
              if (pDVar6 == (DdNode *)0x0) goto LAB_00792170;
              piVar2 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
              *piVar2 = *piVar2 + 1;
              Cudd_RecursiveDeref(dd,pDVar10);
              local_98 = (int)local_98 >> 1;
              lVar13 = lVar13 + -1;
              pDVar10 = pDVar6;
            } while (1 < lVar13);
          }
          pDVar9 = cuddUniqueConst(dd,local_48);
          pDVar10 = pDVar6;
          if (pDVar9 == (DdNode *)0x0) {
LAB_00792170:
            Cudd_RecursiveDeref(dd,pDVar10);
            goto LAB_00791f3b;
          }
          piVar2 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          pDVar10 = Cudd_addIte(dd,pDVar6,pDVar9,*local_68);
          if (pDVar10 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar6);
            pDVar10 = pDVar9;
            goto LAB_00792170;
          }
          piVar2 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          Cudd_RecursiveDeref(dd,pDVar6);
          Cudd_RecursiveDeref(dd,pDVar9);
          ppDVar8 = local_68;
          Cudd_RecursiveDeref(dd,*local_68);
          *ppDVar8 = pDVar10;
          iVar4 = feof(local_60);
        } while (iVar4 == 0);
      }
      local_90 = (DdNode ***)0x1;
      goto LAB_00791f3b;
    }
    uVar14 = (ulong)local_88;
    sVar12 = uVar14 * 8;
    if (local_58 == (DdNode *)0x0) {
      local_58 = (DdNode *)malloc(sVar12);
    }
    else {
      local_58 = (DdNode *)realloc(local_58,sVar12);
    }
    *y = (DdNode **)local_58;
    if (local_58 != (DdNode *)0x0) {
      sVar12 = uVar14 << 3;
      if (*yn_ == (DdNode **)0x0) {
        local_50 = (DdNode *)malloc(sVar12);
      }
      else {
        local_50 = (DdNode *)realloc(*yn_,sVar12);
      }
      *yn_ = (DdNode **)local_50;
      if (local_50 != (DdNode *)0x0) goto LAB_00791d45;
    }
  }
  dd->errorCode = CUDD_MEMORY_OUT;
LAB_00791f33:
  local_90 = (DdNode ***)0x0;
LAB_00791f3b:
  return (int)local_90;
}

Assistant:

int
Cudd_addRead(
  FILE * fp /* input file pointer */,
  DdManager * dd /* DD manager */,
  DdNode ** E /* characteristic function of the graph */,
  DdNode *** x /* array of row variables */,
  DdNode *** y /* array of column variables */,
  DdNode *** xn /* array of complemented row variables */,
  DdNode *** yn_ /* array of complemented column variables */,
  int * nx /* number or row variables */,
  int * ny /* number or column variables */,
  int * m /* number of rows */,
  int * n /* number of columns */,
  int  bx /* first index of row variables */,
  int  sx /* step of row variables */,
  int  by /* first index of column variables */,
  int  sy /* step of column variables */)
{
    DdNode *one, *zero;
    DdNode *w, *neW;
    DdNode *minterm1;
    int u, v, err, i, nv;
    int lnx, lny;
    CUDD_VALUE_TYPE val;
    DdNode **lx, **ly, **lxn, **lyn;

    one = DD_ONE(dd);
    zero = DD_ZERO(dd);

    err = fscanf(fp, "%d %d", &u, &v);
    if (err == EOF) {
        return(0);
    } else if (err != 2) {
        return(0);
    }

    *m = u;
    /* Compute the number of x variables. */
    lx = *x; lxn = *xn;
    u--;        /* row and column numbers start from 0 */
    for (lnx=0; u > 0; lnx++) {
        u >>= 1;
    }
    /* Here we rely on the fact that REALLOC of a null pointer is
    ** translates to an ALLOC.
    */
    if (lnx > *nx) {
        *x = lx = ABC_REALLOC(DdNode *, *x, lnx);
        if (lx == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        *xn = lxn =  ABC_REALLOC(DdNode *, *xn, lnx);
        if (lxn == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    *n = v;
    /* Compute the number of y variables. */
    ly = *y; lyn = *yn_;
    v--;        /* row and column numbers start from 0 */
    for (lny=0; v > 0; lny++) {
        v >>= 1;
    }
    /* Here we rely on the fact that REALLOC of a null pointer is
    ** translates to an ALLOC.
    */
    if (lny > *ny) {
        *y = ly = ABC_REALLOC(DdNode *, *y, lny);
        if (ly == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        *yn_ = lyn =  ABC_REALLOC(DdNode *, *yn_, lny);
        if (lyn == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    /* Create all new variables. */
    for (i = *nx, nv = bx + (*nx) * sx; i < lnx; i++, nv += sx) {
        do {
            dd->reordered = 0;
            lx[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (lx[i] == NULL) return(0);
        cuddRef(lx[i]);
        do {
            dd->reordered = 0;
            lxn[i] = cuddUniqueInter(dd, nv, zero, one);
        } while (dd->reordered == 1);
        if (lxn[i] == NULL) return(0);
        cuddRef(lxn[i]);
    }
    for (i = *ny, nv = by + (*ny) * sy; i < lny; i++, nv += sy) {
        do {
            dd->reordered = 0;
            ly[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (ly[i] == NULL) return(0);
        cuddRef(ly[i]);
        do {
            dd->reordered = 0;
            lyn[i] = cuddUniqueInter(dd, nv, zero, one);
        } while (dd->reordered == 1);
        if (lyn[i] == NULL) return(0);
        cuddRef(lyn[i]);
    }
    *nx = lnx;
    *ny = lny;

    *E = dd->background; /* this call will never cause reordering */
    cuddRef(*E);

    while (! feof(fp)) {
        err = fscanf(fp, "%d %d %lf", &u, &v, &val);
        if (err == EOF) {
            break;
        } else if (err != 3) {
            return(0);
        } else if (u >= *m || v >= *n || u < 0 || v < 0) {
            return(0);
        }
 
        minterm1 = one; cuddRef(minterm1);

        /* Build minterm1 corresponding to this arc */
        for (i = lnx - 1; i>=0; i--) {
            if (u & 1) {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, lx[i]);
            } else {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, lxn[i]);
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd, minterm1);
            minterm1 = w;
            u >>= 1;
        }
        for (i = lny - 1; i>=0; i--) {
            if (v & 1) {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, ly[i]);
            } else {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, lyn[i]);
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd, minterm1);
            minterm1 = w;
            v >>= 1;
        }
        /* Create new constant node if necessary.
        ** This call will never cause reordering.
        */
        neW = cuddUniqueConst(dd, val);
        if (neW == NULL) {
            Cudd_RecursiveDeref(dd, minterm1);
            return(0);
        }
        cuddRef(neW);

        w = Cudd_addIte(dd, minterm1, neW, *E);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, minterm1);
            Cudd_RecursiveDeref(dd, neW);
            return(0);
        }
        cuddRef(w);
        Cudd_RecursiveDeref(dd, minterm1);
        Cudd_RecursiveDeref(dd, neW);
        Cudd_RecursiveDeref(dd, *E);
        *E = w;
    }
    return(1);

}